

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_amount.cpp
# Opt level: O0

void cfd::core::Amount::CheckValidAmount(int64_t satoshi_amount)

{
  bool bVar1;
  CfdException *this;
  allocator local_49;
  string local_48;
  CfdSourceLocation local_28;
  int64_t local_10;
  int64_t satoshi_amount_local;
  
  local_10 = satoshi_amount;
  bVar1 = IsValidAmount(satoshi_amount);
  if (!bVar1) {
    local_28.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_amount.cpp"
                 ,0x2f);
    local_28.filename = local_28.filename + 1;
    local_28.line = 0x33;
    local_28.funcname = "CheckValidAmount";
    logger::warn<long&>(&local_28,"Amount out of range. amount={}.",&local_10);
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_48,"Amount out of range.",&local_49);
    CfdException::CfdException(this,kCfdOutOfRangeError,&local_48);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

void Amount::CheckValidAmount(int64_t satoshi_amount) {
  if (!IsValidAmount(satoshi_amount)) {
    warn(CFD_LOG_SOURCE, "Amount out of range. amount={}.", satoshi_amount);
    throw CfdException(kCfdOutOfRangeError, "Amount out of range.");
  }
}